

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

int GetMonitorPhysicalWidth(int monitor)

{
  GLFWmonitor **ppGVar1;
  int width;
  int monitorCount;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = 0;
  ppGVar1 = glfwGetMonitors(&local_c);
  if ((monitor < 0) || (local_c <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
  }
  else {
    glfwGetMonitorPhysicalSize(ppGVar1[(uint)monitor],&local_10,(int *)0x0);
  }
  return local_10;
}

Assistant:

int GetMonitorPhysicalWidth(int monitor)
{
    int width = 0;
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount)) glfwGetMonitorPhysicalSize(monitors[monitor], &width, NULL);
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");

    return width;
}